

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_streamable<trng::uniform01_dist<double>>(uniform01_dist<double> *d)

{
  param_type p_new;
  StringRef local_218;
  AssertionHandler catchAssertionHandler;
  StringRef local_1c0;
  SourceLineInfo local_1b0;
  stringstream str;
  basic_ostream<char,_std::char_traits<char>_> local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  trng::operator<<(local_190,(param_type *)&catchAssertionHandler);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)&str,&p_new);
  local_218.m_start = "REQUIRE";
  local_218.m_size = 7;
  local_1b0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1b0.line = 0xcd;
  Catch::StringRef::StringRef(&local_1c0,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_218,&local_1b0,local_1c0,Normal);
  local_218.m_start = (char *)CONCAT71(local_218.m_start._1_7_,1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_218);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}